

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qplatformdialoghelper.cpp
# Opt level: O0

void QPlatformColorDialogHelper::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  QPlatformColorDialogHelper *_t;
  uint in_stack_ffffffffffffffb8;
  QPlatformColorDialogHelper *in_stack_ffffffffffffffc0;
  
  if (in_ESI == 0) {
    if (in_EDX == 0) {
      currentColorChanged(in_stack_ffffffffffffffc0,(QColor *)(ulong)in_stack_ffffffffffffffb8);
    }
    else if (in_EDX == 1) {
      colorSelected(in_stack_ffffffffffffffc0,(QColor *)CONCAT44(1,in_stack_ffffffffffffffb8));
    }
  }
  if ((in_ESI == 5) &&
     (bVar1 = QtMocHelpers::indexOfMethod<void(QPlatformColorDialogHelper::*)(QColor_const&)>
                        (in_RCX,(void **)currentColorChanged,0,0), !bVar1)) {
    QtMocHelpers::indexOfMethod<void(QPlatformColorDialogHelper::*)(QColor_const&)>
              (in_RCX,(void **)colorSelected,0,1);
  }
  return;
}

Assistant:

void QPlatformColorDialogHelper::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QPlatformColorDialogHelper *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentColorChanged((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        case 1: _t->colorSelected((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QPlatformColorDialogHelper::*)(const QColor & )>(_a, &QPlatformColorDialogHelper::currentColorChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QPlatformColorDialogHelper::*)(const QColor & )>(_a, &QPlatformColorDialogHelper::colorSelected, 1))
            return;
    }
}